

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

bool __thiscall QAbstractItemView::focusNextPrevChild(QAbstractItemView *this,bool next)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_a8;
  QKeyEvent event;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(char *)(*(long *)(this + 8) + 0x3c8) == '\x01') &&
      ((*(uint *)(*(long *)(this + 0x20) + 8) & 0x8001) == 0x8000)) &&
     ((*(byte *)(*(long *)(*(long *)(*(long *)(this + 8) + 0x2b0) + 0x20) + 8) & 1) == 0)) {
    _event = &DAT_aaaaaaaaaaaaaaaa;
    local_a8.d = (Data *)0x0;
    local_a8.ptr = (char16_t *)0x0;
    local_a8.size = 0;
    QKeyEvent::QKeyEvent(&event,6,0x1000002 - (uint)next,0,&local_a8,0,1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    (**(code **)(*(long *)this + 0xc0))(this,&event);
    QKeyEvent::~QKeyEvent(&event);
    bVar2 = true;
  }
  else {
    bVar2 = QWidget::focusNextPrevChild((QWidget *)this,next);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QAbstractItemView::focusNextPrevChild(bool next)
{
    Q_D(QAbstractItemView);
    if (d->tabKeyNavigation && isVisible() && isEnabled() && d->viewport->isEnabled()) {
        QKeyEvent event(QEvent::KeyPress, next ? Qt::Key_Tab : Qt::Key_Backtab, Qt::NoModifier);
        keyPressEvent(&event);
        if (event.isAccepted())
            return true;
    }
    return QAbstractScrollArea::focusNextPrevChild(next);
}